

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall
ON_SubDMeshImpl::GetTightBoundingBox
          (ON_SubDMeshImpl *this,ON_BoundingBox *bbox,bool bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  uint count;
  ON_SubDMeshFragment *local_60;
  ON_SubDMeshFragment *fragment;
  ON_BoundingBox local_bbox;
  ON_Xform *xform_local;
  bool bGrowBox_local;
  ON_BoundingBox *bbox_local;
  ON_SubDMeshImpl *this_local;
  
  local_bbox.m_max.z = (double)xform;
  memcpy(&fragment,&ON_BoundingBox::EmptyBoundingBox,0x30);
  if ((local_bbox.m_max.z != 0.0) &&
     (bVar1 = ON_Xform::IsIdentity((ON_Xform *)local_bbox.m_max.z,0.0), bVar1)) {
    local_bbox.m_max.z = 0.0;
  }
  if (local_bbox.m_max.z == 0.0) {
    memcpy(&fragment,&this->m_bbox,0x30);
  }
  else {
    for (local_60 = this->m_first_fragment; local_60 != (ON_SubDMeshFragment *)0x0;
        local_60 = local_60->m_next_fragment) {
      count = ON_SubDMeshFragment::PointCount(local_60);
      ON_GetPointListBoundingBox
                (3,false,count,(int)local_60->m_P_stride,local_60->m_P,(ON_BoundingBox *)&fragment,
                 (uint)(local_60 != this->m_first_fragment),(ON_Xform *)local_bbox.m_max.z);
    }
  }
  if ((bGrowBox) && (bVar1 = ON_BoundingBox::IsValid(bbox), bVar1)) {
    ON_BoundingBox::Union(bbox,(ON_BoundingBox *)&fragment);
  }
  else {
    memcpy(bbox,&fragment,0x30);
  }
  return true;
}

Assistant:

bool ON_SubDMeshImpl::GetTightBoundingBox(
  ON_BoundingBox& bbox,
  bool bGrowBox,
  const ON_Xform* xform
  ) const
{
  ON_BoundingBox local_bbox = ON_BoundingBox::EmptyBoundingBox;
  if (nullptr != xform && xform->IsIdentity())
    xform = nullptr;

  if (nullptr == xform)
  {
    local_bbox = m_bbox;
  }
  else
  {
    for (const ON_SubDMeshFragment* fragment = m_first_fragment; nullptr != fragment; fragment = fragment->m_next_fragment)
      ON_GetPointListBoundingBox(3, 0, fragment->PointCount(), (int)fragment->m_P_stride, fragment->m_P, local_bbox, fragment != m_first_fragment, xform);
  }

  if (bGrowBox && bbox.IsValid())
    bbox.Union(local_bbox);
  else
    bbox = local_bbox;

  return true;
}